

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkipList.hpp
# Opt level: O2

Clause * __thiscall
Lib::SkipList<Kernel::Clause_*,_Lib::Int>::pop(SkipList<Kernel::Clause_*,_Lib::Int> *this)

{
  uint uVar1;
  Node *node;
  Clause *pCVar2;
  uint uVar3;
  ulong uVar4;
  
  node = this->_left->nodes[0];
  uVar1 = this->_top;
  uVar3 = 1;
  if (1 < uVar1) {
    uVar3 = uVar1;
  }
  uVar4 = 1;
  do {
    if (uVar1 <= uVar4) {
LAB_00502333:
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        this->_left->nodes[uVar4] = node->nodes[uVar4];
      }
      pCVar2 = node->value;
      deallocate(node,uVar3 - 1);
      return pCVar2;
    }
    if (this->_left->nodes[uVar4] != node) {
      uVar3 = (uint)uVar4;
      goto LAB_00502333;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

Value pop()
  {
    ASS(isNonEmpty());

    // find the height of the first
    Node* node = _left->nodes[0];
    unsigned h;
    for (h = 1;h < _top;h++) {
      if (_left->nodes[h] != node) {
	break;
      }
    }
    // the height of the first node is h-1
    for (unsigned i = 0;i < h;i++) {
      _left->nodes[i] = node->nodes[i];
    }
    Value val = node->value;
    deallocate(node,h-1);
    return val;
  }